

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O1

int SSL_CREDENTIAL_set_private_key_method(SSL_CREDENTIAL *cred,SSL_PRIVATE_KEY_METHOD *key_method)

{
  int iVar1;
  
  if (cred->type < kSPAKE2PlusV1Client) {
    std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)&cred->privkey,(pointer)0x0)
    ;
    cred->key_method = key_method;
    iVar1 = 1;
  }
  else {
    if (1 < cred->type - kSPAKE2PlusV1Client) {
      abort();
    }
    iVar1 = 0;
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0x16f);
  }
  return iVar1;
}

Assistant:

int SSL_CREDENTIAL_set_private_key_method(
    SSL_CREDENTIAL *cred, const SSL_PRIVATE_KEY_METHOD *key_method) {
  if (!cred->UsesPrivateKey()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  cred->privkey = nullptr;
  cred->key_method = key_method;
  return 1;
}